

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::get_constant_quad_lane(Value *lane,uint32_t *quad_lane)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint in_EAX;
  ValueKind VVar4;
  BinaryOps BVar5;
  BinaryOperator *this;
  Value *value;
  Value *value_00;
  BinaryOperator *this_00;
  uint32_t secondary_quad_lane;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  if (lane == (Value *)0x0) {
    this_00 = (BinaryOperator *)0x0;
  }
  else {
    this = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(lane);
    VVar4 = LLVMBC::Value::get_value_kind((Value *)this);
    this_00 = (BinaryOperator *)0x0;
    if (VVar4 == BinaryOperator) {
      this_00 = this;
    }
  }
  if (this_00 == (BinaryOperator *)0x0) {
    return false;
  }
  value = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
  value_00 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
  bVar1 = value_is_wave_lane(value);
  bVar2 = value_is_wave_lane(value_00);
  uStack_38 = (ulong)(uint)uStack_38;
  BVar5 = LLVMBC::BinaryOperator::getOpcode(this_00);
  if (BVar5 == Or) {
    bVar3 = get_constant_int(value,quad_lane);
    if ((bVar2 && bVar3) || ((bVar1 && (bVar1 = get_constant_int(value_00,quad_lane), bVar1)))) {
      return *quad_lane == 3;
    }
  }
  else {
    BVar5 = LLVMBC::BinaryOperator::getOpcode(this_00);
    if (BVar5 == And) {
      bVar3 = get_constant_int(value,quad_lane);
      if (!bVar2 || !bVar3) {
        if (!bVar1) {
          return false;
        }
        bVar1 = get_constant_int(value_00,quad_lane);
        if (!bVar1) {
          return false;
        }
      }
      if (*quad_lane != 0xfffffffc) {
        return false;
      }
      *quad_lane = 0;
      return true;
    }
    BVar5 = LLVMBC::BinaryOperator::getOpcode(this_00);
    if (BVar5 != Add) {
      return false;
    }
  }
  bVar1 = get_constant_int(value,quad_lane);
  if (((!bVar1) ||
      (bVar1 = get_constant_quad_lane(value_00,(uint32_t *)((long)&uStack_38 + 4)), !bVar1)) &&
     ((bVar1 = get_constant_quad_lane(value,(uint32_t *)((long)&uStack_38 + 4)), !bVar1 ||
      (bVar1 = get_constant_int(value_00,quad_lane), !bVar1)))) {
    return false;
  }
  return uStack_38._4_4_ == 0 && *quad_lane < 4;
}

Assistant:

static bool get_constant_quad_lane(const llvm::Value *lane, uint32_t *quad_lane)
{
	// Cases to consider:
	// - (gl_SubgroupInvocationID & ~3u) | C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) + C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) -> C = 0
	// - (gl_SubgroupInvocationID | 3u) -> C = 3
	auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(lane);
	if (!binop)
		return false;

	auto *lhs = binop->getOperand(0);
	auto *rhs = binop->getOperand(1);
	bool lhs_is_wave_lane = value_is_wave_lane(lhs);
	bool rhs_is_wave_lane = value_is_wave_lane(rhs);
	uint32_t secondary_quad_lane = 0;

	if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 3
			return *quad_lane == 3;
		}
		else if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		         (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::And)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 2
			if (*quad_lane == ~3u)
			{
				*quad_lane = 0;
				return true;
			}
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add)
	{
		if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		    (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}

	return false;
}